

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr,REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  REF_EDGE ref_edge;
  REF_CELL *ppRVar5;
  REF_INT *__s;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  long local_48;
  
  ref_edge = (REF_EDGE)malloc(0x20);
  *ref_edge_ptr = ref_edge;
  if (ref_edge == (REF_EDGE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x45,
           "ref_edge_create","malloc *ref_edge_ptr of REF_EDGE_STRUCT NULL");
    return 2;
  }
  ref_edge->n = 0;
  ref_edge->max = 0;
  ref_edge->e2n = (REF_INT *)0x0;
  uVar3 = ref_adj_create(&ref_edge->adj);
  if (uVar3 == 0) {
    pRVar1 = ref_grid->node;
    ref_edge->node = pRVar1;
    if (ref_edge->e2n != (REF_INT *)0x0) {
LAB_001808c9:
      ppRVar5 = ref_grid->cell + 8;
      lVar6 = 8;
      do {
        pRVar2 = *ppRVar5;
        iVar4 = pRVar2->max;
        if (0 < iVar4) {
          iVar12 = 0;
          do {
            if ((pRVar2->c2n[(long)pRVar2->size_per * (long)iVar12] != -1) && (0 < pRVar2->edge_per)
               ) {
              lVar11 = 0;
              do {
                lVar9 = (long)pRVar2->size_per * (long)iVar12;
                uVar3 = ref_edge_uniq(ref_edge,pRVar2->c2n[pRVar2->e2n[lVar11 * 2] + lVar9],
                                      pRVar2->c2n
                                      [(long)(int)lVar9 + (long)pRVar2->e2n[lVar11 * 2 + 1]]);
                if (uVar3 != 0) {
                  uVar7 = 0x31;
                  goto LAB_00180a61;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < pRVar2->edge_per);
              iVar4 = pRVar2->max;
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < iVar4);
        }
        ppRVar5 = ref_grid->cell + lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      ppRVar5 = ref_grid->cell + 3;
      local_48 = 3;
      while( true ) {
        pRVar2 = *ppRVar5;
        iVar4 = pRVar2->max;
        if (0 < iVar4) break;
LAB_00180a13:
        ppRVar5 = ref_grid->cell + local_48 + 1;
        local_48 = local_48 + 1;
        if (local_48 == 8) {
          return 0;
        }
      }
      iVar12 = 0;
LAB_001809a4:
      if ((pRVar2->c2n[(long)pRVar2->size_per * (long)iVar12] != -1) && (0 < pRVar2->edge_per)) {
        lVar6 = 0;
LAB_001809c3:
        lVar11 = (long)pRVar2->size_per * (long)iVar12;
        uVar3 = ref_edge_uniq(ref_edge,pRVar2->c2n[pRVar2->e2n[lVar6 * 2] + lVar11],
                              pRVar2->c2n[(long)(int)lVar11 + (long)pRVar2->e2n[lVar6 * 2 + 1]]);
        if (uVar3 == 0) goto code_r0x001809fb;
        uVar7 = 0x3a;
LAB_00180a61:
        uVar8 = (ulong)uVar3;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               uVar7,"ref_edge_builder_uniq",uVar8,"add uniq");
        goto LAB_00180aaa;
      }
      goto LAB_00180a0b;
    }
    if ((long)ref_edge->max == 0) {
      iVar4 = pRVar1->n;
      iVar12 = 100;
      if (0xc < iVar4) {
        iVar12 = iVar4 * 8;
      }
      ref_edge->max = iVar12;
      uVar3 = iVar12 * 2;
      __s = (REF_INT *)malloc((ulong)uVar3 * 4);
      ref_edge->e2n = __s;
      if (__s != (REF_INT *)0x0) {
        if (0 < iVar12) {
          uVar8 = 1;
          if (1 < (int)uVar3) {
            uVar8 = (ulong)uVar3;
          }
          memset(__s,0xff,uVar8 << 2);
        }
        goto LAB_001808c9;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x29,
             "ref_edge_builder_uniq","malloc ref_edge->e2n of REF_INT NULL");
      uVar8 = 2;
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x25,
             "ref_edge_builder_uniq","should be zero size",0,(long)ref_edge->max);
      uVar8 = 1;
    }
LAB_00180aaa:
    pcVar10 = "build edges";
    uVar7 = 0x51;
  }
  else {
    uVar8 = (ulong)uVar3;
    pcVar10 = "create adj";
    uVar7 = 0x4d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar7,
         "ref_edge_create",uVar8,pcVar10);
  return (REF_STATUS)uVar8;
code_r0x001809fb:
  lVar6 = lVar6 + 1;
  if (pRVar2->edge_per <= lVar6) goto code_r0x00180a07;
  goto LAB_001809c3;
code_r0x00180a07:
  iVar4 = pRVar2->max;
LAB_00180a0b:
  iVar12 = iVar12 + 1;
  if (iVar4 <= iVar12) goto LAB_00180a13;
  goto LAB_001809a4;
}

Assistant:

REF_FCN REF_STATUS ref_edge_create(REF_EDGE *ref_edge_ptr, REF_GRID ref_grid) {
  REF_EDGE ref_edge;

  ref_malloc(*ref_edge_ptr, 1, REF_EDGE_STRUCT);

  ref_edge = *ref_edge_ptr;

  ref_edge_n(ref_edge) = 0;
  ref_edge_max(ref_edge) = 0;
  ref_edge->e2n = (REF_INT *)NULL;

  RSS(ref_adj_create(&(ref_edge_adj(ref_edge))), "create adj");

  ref_edge_node(ref_edge) = ref_grid_node(ref_grid);

  RSS(ref_edge_builder_uniq(ref_edge, ref_grid), "build edges");

  return REF_SUCCESS;
}